

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::prepareSSBs
          (TextureTestBase *this,GLuint param_1,ShaderInterface *si,Program *program,Buffer *buffer)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference ppVVar4;
  int *piVar5;
  Variable *variable_1;
  int local_48;
  GLuint i_1;
  GLint ends_at;
  GLint variable_stride;
  Variable *variable;
  GLuint i;
  GLint ssbs_stride;
  Buffer *buffer_local;
  Program *program_local;
  ShaderInterface *si_local;
  TextureTestBase *pTStack_10;
  GLuint param_1_local;
  TextureTestBase *this_local;
  
  _i = buffer;
  buffer_local = (Buffer *)program;
  program_local = (Program *)si;
  si_local._4_4_ = param_1;
  pTStack_10 = this;
  sVar2 = std::
          vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
          ::size(&si->m_ssb_blocks);
  if (sVar2 != 0) {
    variable._4_4_ = 0;
    for (variable._0_4_ = 0; uVar3 = (ulong)(uint)variable,
        sVar2 = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ::size((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                        *)&program_local->m_context), uVar3 < sVar2;
        variable._0_4_ = (uint)variable + 1) {
      ppVVar4 = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ::operator[]((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                              *)&program_local->m_context,(ulong)(uint)variable);
      _ends_at = *ppVVar4;
      bVar1 = Utils::Variable::IsBlock(_ends_at);
      if (bVar1) {
        i_1 = Utils::Variable::GetStride(_ends_at);
        local_48 = i_1 + (_ends_at->m_descriptor).m_offset;
        piVar5 = std::max<int>((int *)((long)&variable + 4),&local_48);
        variable._4_4_ = *piVar5;
      }
    }
    Utils::Program::Use((Program *)buffer_local);
    Utils::Buffer::Bind(_i);
    Utils::Buffer::Data(_i,StaticDraw,(long)variable._4_4_,(GLvoid *)0x0);
    for (variable_1._4_4_ = 0;
        sVar2 = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ::size((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                        *)&program_local->m_context), variable_1._4_4_ < sVar2;
        variable_1._4_4_ = variable_1._4_4_ + 1) {
      ppVVar4 = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ::operator[]((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                              *)&program_local->m_context,(ulong)variable_1._4_4_);
      prepareUniform(this,(Program *)buffer_local,*ppVVar4,_i);
    }
  }
  return;
}

Assistant:

void TextureTestBase::prepareSSBs(GLuint /* test_case_index */, Utils::ShaderInterface& si, Utils::Program& program,
								  Utils::Buffer& buffer)
{
	/* Skip if there are no input variables in vertex shader */
	if (0 == si.m_ssb_blocks.size())
	{
		return;
	}

	/* Calculate vertex stride */
	GLint ssbs_stride = 0;

	for (GLuint i = 0; i < si.m_ssb_blocks.size(); ++i)
	{
		Utils::Variable& variable = *si.m_ssb_blocks[i];

		if (false == variable.IsBlock())
		{
			continue;
		}

		GLint variable_stride = variable.GetStride();

		GLint ends_at = variable_stride + variable.m_descriptor.m_offset;

		ssbs_stride = std::max(ssbs_stride, ends_at);
	}

	/* Set active program */
	program.Use();

	/* Allocate */
	buffer.Bind();
	buffer.Data(Utils::Buffer::StaticDraw, ssbs_stride, 0);

	/* Set up uniforms */
	for (GLuint i = 0; i < si.m_ssb_blocks.size(); ++i)
	{
		Utils::Variable& variable = *si.m_ssb_blocks[i];

		/* prepareUnifor should work fine for ssb blocks */
		prepareUniform(program, variable, buffer);
	}
}